

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanNMTOKEN(QXmlStreamReaderPrivate *this)

{
  QStringView s;
  uint ch;
  NameChar NVar1;
  qsizetype qVar2;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype pos;
  uint c;
  qsizetype n;
  qsizetype in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  long local_38;
  QXmlStreamReaderPrivate *this_00;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffffd8;
  qsizetype in_stack_fffffffffffffff0;
  storage_type_conflict *psVar3;
  
  psVar3 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  this_00 = in_RDI;
  do {
    ch = getChar(this_00);
    if (ch == 0xffffffff) {
      qVar2 = QString::size(&in_RDI->textBuffer);
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT44(ch,in_stack_ffffffffffffffc0),(QString *)(qVar2 - local_38)
                );
      s.m_data = psVar3;
      s.m_size = in_stack_fffffffffffffff0;
      putString(in_stack_ffffffffffffffd8,s,(qsizetype)this_00);
      QString::resize((QString *)in_RDI,in_stack_ffffffffffffffa8);
LAB_00656cb4:
      if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) == psVar3) {
        return local_38;
      }
      __stack_chk_fail();
    }
    QChar::QChar<unsigned_int,_true>((QChar *)&stack0xfffffffffffffff6,ch);
    NVar1 = fastDetermineNameChar((QChar)(char16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
    if (NVar1 == NotName) {
      putChar(in_RDI,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      goto LAB_00656cb4;
    }
    local_38 = local_38 + 1;
    QChar::QChar<unsigned_int,_true>((QChar *)&stack0xfffffffffffffff4,ch);
    QString::operator+=((QString *)in_RDI,
                        (QChar)(char16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30));
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanNMTOKEN()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (fastDetermineNameChar(QChar(c)) == NotName) {
            putChar(c);
            return n;
        } else {
            ++n;
            textBuffer += QChar(c);
        }
    }

    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);

    return n;
}